

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleanimation_p.h
# Opt level: O1

void __thiscall QNumberStyleAnimation::~QNumberStyleAnimation(QNumberStyleAnimation *this)

{
  QAbstractAnimation::~QAbstractAnimation((QAbstractAnimation *)this);
  operator_delete(this,0x40);
  return;
}

Assistant:

class Q_WIDGETS_EXPORT QNumberStyleAnimation : public QStyleAnimation
{
    Q_OBJECT

public:
    QNumberStyleAnimation(QObject *target);

    qreal startValue() const;
    void setStartValue(qreal value);

    qreal endValue() const;
    void setEndValue(qreal value);

    qreal currentValue() const;

protected:
    bool isUpdateNeeded() const override;

private:
    qreal _start;
    qreal _end;
    mutable qreal _prev;
}